

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall basisu::vector<basisu::encoder_block>::clear(vector<basisu::encoder_block> *this)

{
  if (this->m_p != (encoder_block *)0x0) {
    free(this->m_p);
    this->m_p = (encoder_block *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }